

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O1

_Bool trans_FADDA(DisasContext_conflict1 *s,arg_rprr_esz *a)

{
  int iVar1;
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var2;
  uint32_t uVar3;
  TCGv_i64 v;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGv_ptr pTVar4;
  TCGv_i32 pTVar5;
  uintptr_t o_1;
  uintptr_t o;
  uintptr_t o_2;
  
  iVar1 = a->esz;
  if (iVar1 != 0) {
    tcg_ctx = s->uc->tcg_ctx;
    uVar3 = s->sve_len;
    _Var2 = sve_access_check_aarch64(s);
    if (_Var2) {
      v = load_esz(tcg_ctx,tcg_ctx->cpu_env,a->rn * 0x100 + 0xc10,a->esz);
      ts = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
      ts_00 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
      tcg_gen_addi_i64_aarch64
                (tcg_ctx,(TCGv_i64)((long)ts - (long)tcg_ctx),(TCGv_i64)tcg_ctx->cpu_env,
                 (long)(a->rm * 0x100 + 0xc10));
      tcg_gen_addi_i64_aarch64
                (tcg_ctx,(TCGv_i64)((long)ts_00 - (long)tcg_ctx),(TCGv_i64)tcg_ctx->cpu_env,
                 (long)(a->pg * 0x20 + 0x2c10));
      pTVar4 = get_fpstatus_ptr_aarch64(tcg_ctx,a->esz == 1);
      uVar3 = simd_desc_aarch64(uVar3,uVar3,0);
      pTVar5 = tcg_const_i32_aarch64(tcg_ctx,uVar3);
      (**(code **)(&UNK_01071268 + (long)a->esz * 8))
                (tcg_ctx,v,v,(TCGv_i64)((long)ts - (long)tcg_ctx),
                 (TCGv_i64)((long)ts_00 - (long)tcg_ctx),pTVar4,pTVar5);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar5 + (long)tcg_ctx));
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
      tcg_temp_free_internal_aarch64(tcg_ctx,ts_00);
      tcg_temp_free_internal_aarch64(tcg_ctx,ts);
      write_fp_dreg_aarch64(s,a->rd,v);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(v + (long)tcg_ctx));
    }
  }
  return iVar1 != 0;
}

Assistant:

static bool trans_FADDA(DisasContext *s, arg_rprr_esz *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    typedef void fadda_fn(TCGContext *, TCGv_i64, TCGv_i64, TCGv_ptr,
                          TCGv_ptr, TCGv_ptr, TCGv_i32);
    static fadda_fn * const fns[3] = {
        gen_helper_sve_fadda_h,
        gen_helper_sve_fadda_s,
        gen_helper_sve_fadda_d,
    };
    unsigned vsz = vec_full_reg_size(s);
    TCGv_ptr t_rm, t_pg, t_fpst;
    TCGv_i64 t_val;
    TCGv_i32 t_desc;

    if (a->esz == 0) {
        return false;
    }
    if (!sve_access_check(s)) {
        return true;
    }

    t_val = load_esz(tcg_ctx, tcg_ctx->cpu_env, vec_reg_offset(s, a->rn, 0, a->esz), a->esz);
    t_rm = tcg_temp_new_ptr(tcg_ctx);
    t_pg = tcg_temp_new_ptr(tcg_ctx);
    tcg_gen_addi_ptr(tcg_ctx, t_rm, tcg_ctx->cpu_env, vec_full_reg_offset(s, a->rm));
    tcg_gen_addi_ptr(tcg_ctx, t_pg, tcg_ctx->cpu_env, pred_full_reg_offset(s, a->pg));
    t_fpst = get_fpstatus_ptr(tcg_ctx, a->esz == MO_16);
    t_desc = tcg_const_i32(tcg_ctx, simd_desc(vsz, vsz, 0));

    fns[a->esz - 1](tcg_ctx,t_val, t_val, t_rm, t_pg, t_fpst, t_desc);

    tcg_temp_free_i32(tcg_ctx, t_desc);
    tcg_temp_free_ptr(tcg_ctx, t_fpst);
    tcg_temp_free_ptr(tcg_ctx, t_pg);
    tcg_temp_free_ptr(tcg_ctx, t_rm);

    write_fp_dreg(s, a->rd, t_val);
    tcg_temp_free_i64(tcg_ctx, t_val);
    return true;
}